

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O0

uint __thiscall o3dgc::Arithmetic_Codec::stop_encoder(Arithmetic_Codec *this)

{
  uint uVar1;
  uint code_bytes;
  uint init_base;
  Arithmetic_Codec *this_local;
  
  if (this->mode != 1) {
    AC_Error("invalid to stop encoder");
  }
  this->mode = 0;
  uVar1 = this->base;
  if (this->length < 0x2000001) {
    this->base = this->base + 0x800000;
    this->length = 0x8000;
  }
  else {
    this->base = this->base + 0x1000000;
    this->length = 0x800000;
  }
  if (this->base < uVar1) {
    propagate_carry(this);
  }
  renorm_enc_interval(this);
  uVar1 = (int)this->ac_pointer - (int)this->code_buffer;
  if (this->buffer_size < uVar1) {
    AC_Error("code buffer overflow");
  }
  return uVar1;
}

Assistant:

unsigned Arithmetic_Codec::stop_encoder(void)
    {
      if (mode != 1) AC_Error("invalid to stop encoder");
      mode = 0;

      unsigned init_base = base;            // done encoding: set final data bytes

      if (length > 2 * AC__MinLength) {
        base  += AC__MinLength;                                     // base offset
        length = AC__MinLength >> 1;             // set new length for 1 more byte
      }
      else {
        base  += AC__MinLength >> 1;                                // base offset
        length = AC__MinLength >> 9;            // set new length for 2 more bytes
      }

      if (init_base > base) propagate_carry();                 // overflow = carry

      renorm_enc_interval();                // renormalization = output last bytes

      unsigned code_bytes = unsigned(ac_pointer - code_buffer);
      if (code_bytes > buffer_size) AC_Error("code buffer overflow");

      return code_bytes;                                   // number of bytes used
    }